

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-magic.c
# Opt level: O3

borg_magic * borg_get_spell_entry(wchar_t book,wchar_t entry)

{
  borg_magic *pbVar1;
  long lVar2;
  wchar_t wVar3;
  
  lVar2 = (long)(player->class->magic).total_spells;
  if (0 < lVar2) {
    wVar3 = L'\0';
    pbVar1 = borg_magics;
    do {
      if (pbVar1->book == book) {
        if (wVar3 == entry) {
          return pbVar1;
        }
        wVar3 = wVar3 + L'\x01';
      }
      pbVar1 = pbVar1 + 1;
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  return (borg_magic *)0x0;
}

Assistant:

borg_magic *borg_get_spell_entry(int book, int entry)
{
    int entry_in_book = 0;

    for (int spell_num = 0; spell_num < player->class->magic.total_spells;
         spell_num++) {
        if (borg_magics[spell_num].book == book) {
            if (entry_in_book == entry)
                return &borg_magics[spell_num];
            entry_in_book++;
        }
    }
    return NULL;
}